

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O2

Error * ot::commissioner::security_material::GetDomainSM
                  (Error *__return_storage_ptr__,string *aDid,SecurityMaterials *aSM)

{
  char cVar1;
  ErrorCode EVar2;
  _Alloc_hider _Var3;
  ErrorCode EVar4;
  string *psVar5;
  char *pcVar6;
  Error *pEVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __rhs;
  long lVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  allocator local_1f9;
  Error *local_1f8;
  ErrorCode local_1ec;
  Error tokenError;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  local_198;
  writer write_1;
  writer write;
  string path;
  string out;
  string domPath;
  ByteArray bytes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  string local_90;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  domPath._M_dataplus._M_p = (pointer)&domPath.field_2;
  domPath._M_string_length = 0;
  domPath.field_2._M_local_buf[0] = '\0';
  out._M_dataplus._M_p = (pointer)&aSM->mCertificate;
  local_1f8 = __return_storage_ptr__;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
              *)&tokenError,(char (*) [9])0x20aec5,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> **)&out);
  path._M_dataplus._M_p = (pointer)&aSM->mPrivateKey;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[9],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            (&local_1c0,(char (*) [9])0x20ae65,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> **)&path);
  write.handler_ = (format_string_checker<char> *)&aSM->mTrustAnchor;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>
  ::pair<const_char_(&)[7],_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_true>
            (&local_198,(char (*) [7])0x20ae07,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> **)&write);
  __l._M_len = 3;
  __l._M_array = (iterator)&tokenError;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::vector(&smElements,__l,(allocator_type *)&bytes);
  lVar9 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&tokenError.mCode + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x28);
  std::__cxx11::string::string((string *)&tokenError,(string *)smRoot);
  _Var3 = tokenError.mMessage._M_dataplus;
  std::__cxx11::string::~string((string *)&tokenError);
  if (_Var3._M_p != (pointer)0x0) {
    std::__cxx11::string::string((string *)&tokenError,(string *)smRoot);
    psVar5 = (string *)std::__cxx11::string::append((char *)&tokenError);
    pcVar6 = (char *)std::__cxx11::string::append(psVar5);
    std::__cxx11::string::append(pcVar6);
    std::__cxx11::string::_M_assign((string *)&domPath);
    std::__cxx11::string::~string((string *)&tokenError);
    std::__cxx11::string::string((string *)&local_70,(string *)&domPath);
    PathExists(&tokenError,&local_70);
    pEVar7 = Error::operator=(local_1f8,&tokenError);
    EVar2 = pEVar7->mCode;
    std::__cxx11::string::~string((string *)&tokenError.mMessage);
    std::__cxx11::string::~string((string *)&local_70);
    if (EVar2 == kNone) {
      for (__rhs = smElements.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __rhs != smElements.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
        std::operator+(&path,&domPath,&__rhs->first);
        tokenError._0_8_ = tokenError._0_8_ & 0xffffffff00000000;
        tokenError.mMessage._M_dataplus._M_p = (pointer)&tokenError.mMessage.field_2;
        tokenError.mMessage._M_string_length = 0;
        tokenError.mMessage.field_2._M_allocated_capacity =
             tokenError.mMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::string((string *)&local_50,(string *)&path);
        PathExists((Error *)&out,&local_50);
        local_1ec = tokenError.mCode;
        EVar2 = (ErrorCode)out._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&out._M_string_length);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&tokenError.mMessage);
        if (local_1ec == EVar2) {
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ReadPemFile(&tokenError,
                      (ByteArray *)
                      &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&path
                     );
          pEVar7 = local_1f8;
          Error::operator=(local_1f8,&tokenError);
          std::__cxx11::string::~string((string *)&tokenError.mMessage);
          tokenError._0_8_ = tokenError._0_8_ & 0xffffffff00000000;
          tokenError.mMessage._M_dataplus._M_p = (pointer)&tokenError.mMessage.field_2;
          tokenError.mMessage._M_string_length = 0;
          tokenError.mMessage.field_2._M_allocated_capacity =
               tokenError.mMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
          EVar2 = pEVar7->mCode;
          std::__cxx11::string::~string((string *)&tokenError.mMessage);
          if (EVar2 == kNone) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (__rhs->second,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          }
          else {
            if (gVerbose == '\x01') {
              tokenError.mCode = kAlreadyExists;
              tokenError.mMessage._M_dataplus._M_p = "Failed to read security data from file {}";
              tokenError.mMessage._M_string_length = 0x29;
              tokenError.mMessage.field_2._M_allocated_capacity = 0x100000000;
              tokenError.mMessage.field_2._8_8_ = &tokenError;
              local_1c0.first._M_dataplus._M_p =
                   (pointer)::fmt::v10::detail::
                            parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar6 = "Failed to read security data from file {}";
              write.handler_ = (format_string_checker<char> *)tokenError.mMessage.field_2._8_8_;
              while (pcVar6 != "") {
                cVar1 = *pcVar6;
                pcVar8 = pcVar6;
                while (cVar1 != '{') {
                  pcVar8 = pcVar8 + 1;
                  if (pcVar8 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&write,pcVar6,"");
                    goto LAB_001c7bb1;
                  }
                  cVar1 = *pcVar8;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write,pcVar6,pcVar8);
                pcVar6 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar8,"",(format_string_checker<char> *)&tokenError);
              }
LAB_001c7bb1:
              tokenError._0_8_ = path._M_dataplus._M_p;
              tokenError.mMessage._M_dataplus._M_p = (pointer)path._M_string_length;
              fmt.size_ = 0xd;
              fmt.data_ = (char *)0x29;
              args.field_1.args_ = in_R9.args_;
              args.desc_ = (unsigned_long_long)&tokenError;
              ::fmt::v10::vformat_abi_cxx11_
                        (&out,(v10 *)"Failed to read security data from file {}",fmt,args);
              Console::Write(&out,kRed);
            }
            else {
              std::__cxx11::string::string((string *)&out,"security-materials",&local_1f9);
              tokenError.mMessage.field_2._8_8_ = &tokenError;
              tokenError.mCode = kAlreadyExists;
              tokenError.mMessage._M_dataplus._M_p = "Failed to read security data from file {}";
              tokenError.mMessage._M_string_length = 0x29;
              tokenError.mMessage.field_2._M_allocated_capacity = 0x100000000;
              local_1c0.first._M_dataplus._M_p =
                   (pointer)::fmt::v10::detail::
                            parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar6 = "Failed to read security data from file {}";
              write_1.handler_ = (format_string_checker<char> *)tokenError.mMessage.field_2._8_8_;
              while (pcVar6 != "") {
                cVar1 = *pcVar6;
                pcVar8 = pcVar6;
                while (cVar1 != '{') {
                  pcVar8 = pcVar8 + 1;
                  if (pcVar8 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&write_1,pcVar6,"");
                    goto LAB_001c7bf5;
                  }
                  cVar1 = *pcVar8;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write_1,pcVar6,pcVar8);
                pcVar6 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar8,"",(format_string_checker<char> *)&tokenError);
              }
LAB_001c7bf5:
              tokenError._0_8_ = path._M_dataplus._M_p;
              tokenError.mMessage._M_dataplus._M_p = (pointer)path._M_string_length;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = (char *)0x29;
              args_00.field_1.args_ = in_R9.args_;
              args_00.desc_ = (unsigned_long_long)&tokenError;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&write,(v10 *)"Failed to read security data from file {}",fmt_00,
                         args_00);
              Log(kError,&out,(string *)&write);
              std::__cxx11::string::~string((string *)&write);
            }
            std::__cxx11::string::~string((string *)&out);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        std::__cxx11::string::~string((string *)&path);
      }
      std::operator+(&path,&domPath,"tok.cbor");
      tokenError._0_8_ = tokenError._0_8_ & 0xffffffff00000000;
      tokenError.mMessage._M_dataplus._M_p = (pointer)&tokenError.mMessage.field_2;
      tokenError.mMessage._M_string_length = 0;
      tokenError.mMessage.field_2._M_allocated_capacity =
           tokenError.mMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::string((string *)&local_90,(string *)&path);
      PathExists((Error *)&out,&local_90);
      EVar2 = tokenError.mCode;
      EVar4 = (ErrorCode)out._M_dataplus._M_p;
      std::__cxx11::string::~string((string *)&out._M_string_length);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&tokenError.mMessage);
      if (EVar2 == EVar4) {
        write.handler_ = (format_string_checker<char> *)0x0;
        ReadHexStringFile(&tokenError,(ByteArray *)&write,&path);
        out._M_dataplus._M_p = out._M_dataplus._M_p & 0xffffffff00000000;
        out._M_string_length = (long)&out.field_2 + 8;
        out.field_2._M_allocated_capacity = 0;
        out.field_2._M_local_buf[8] = '\0';
        EVar2 = tokenError.mCode;
        std::__cxx11::string::~string((string *)&out._M_string_length);
        if (EVar2 == kNone) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&aSM->mCommissionerToken,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&write);
        }
        std::__cxx11::string::~string((string *)&tokenError.mMessage);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&write);
      }
      std::__cxx11::string::~string((string *)&path);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::~vector(&smElements);
  std::__cxx11::string::~string((string *)&domPath);
  return local_1f8;
}

Assistant:

Error GetDomainSM(const std::string &aDid, SecurityMaterials &aSM)
{
    Error               error;
    std::string         domPath;
    std::vector<SMPair> smElements{
        {"cert.pem", &aSM.mCertificate}, {"priv.pem", &aSM.mPrivateKey}, {"ca.pem", &aSM.mTrustAnchor}};

    // If SM root is unset, do nothing
    VerifyOrExit(!smRoot.Get().empty());

    domPath = smRoot.Get().append("dom/").append(aDid).append("/");
    SuccessOrExit(error = PathExists(domPath));
    for (const auto &element : smElements)
    {
        std::string path = domPath + element.first;
        if (ERROR_NONE != PathExists(path))
        {
            continue;
        }
        ByteArray bytes;
        error = ReadPemFile(bytes, path);
        if (error != ERROR_NONE)
        {
            if (gVerbose)
            {
                std::string out = fmt::format(FMT_STRING(SM_ERROR_MESSAGE_PEM_READ_FAILED), path);
                Console::Write(out, Console::Color::kRed);
            }
            else
            {
                LOG_ERROR(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_PEM_READ_FAILED, path);
            }
        }
        else
        {
            *element.second = bytes;
        }
    }

    do
    {
        std::string path = domPath + "tok.cbor";
        if (ERROR_NONE != PathExists(path))
        {
            break;
        }
        ByteArray bytes;
        Error     tokenError = ReadHexStringFile(bytes, path);
        if (ERROR_NONE == tokenError)
        {
            aSM.mCommissionerToken = bytes;
        }
    } while (false);
exit:
    return error;
}